

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

ident * writeident(char *name,int flags)

{
  ident *id_00;
  ident *id;
  int flags_local;
  char *name_local;
  
  id_00 = newident(name,flags);
  if ((id_00->index < 0x19) && ((aliasstack->usedargs & 1 << ((byte)id_00->index & 0x1f)) == 0)) {
    pusharg(id_00,&nullval.super_tagval,aliasstack->argstack + id_00->index);
    aliasstack->usedargs = 1 << ((byte)id_00->index & 0x1f) | aliasstack->usedargs;
  }
  return id_00;
}

Assistant:

ident *writeident(const char *name, int flags)
{
    ident *id = newident(name, flags);
    if(id->index < MAXARGS && !(aliasstack->usedargs&(1<<id->index)))
    {
        pusharg(*id, nullval, aliasstack->argstack[id->index]);
        aliasstack->usedargs |= 1<<id->index;
    }
    return id;
}